

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc.cpp
# Opt level: O2

void * parse_FACT(SymbolContext<char> *ctx)

{
  Number *this;
  size_t __nbytes;
  void *__buf;
  SymbolContext<char> local_30;
  
  __nbytes = ctx->symbol->start;
  if (*(char *)((long)ctx->context->m_window + __nbytes) == '(') {
    this = (Number *)*ctx->values;
  }
  else {
    this = (Number *)operator_new(4);
    Centaurus::SymbolContext<char>::read_abi_cxx11_(&local_30,(int)ctx,__buf,__nbytes);
    Number::Number(this,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

void *parse_FACT(const SymbolContext<char>& ctx)
{
    if (ctx.start()[0] == '(')
        return ctx.value<Number>(1);
    else
        return new Number(ctx.read());
}